

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::DateTruncStatistics<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::DayOperator>
          (vector<duckdb::BaseStatistics,_true> *child_stats)

{
  bool bVar1;
  reference stats;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> in_RDI;
  BaseStatistics result;
  Value max_value;
  Value min_value;
  timestamp_t max_part;
  timestamp_t min_part;
  timestamp_t max;
  timestamp_t min;
  value_type *nstats;
  LogicalType *in_stack_fffffffffffffe88;
  BaseStatistics *in_stack_fffffffffffffe90;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> stats_00;
  BaseStatistics *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee8;
  LogicalType *in_stack_ffffffffffffff58;
  Value local_88;
  int64_t local_48;
  int64_t local_40;
  int64_t local_38;
  int64_t local_30;
  timestamp_t local_28;
  timestamp_t local_20;
  reference local_18;
  
  stats_00._M_head_impl = in_RDI._M_head_impl;
  local_18 = vector<duckdb::BaseStatistics,_true>::operator[]
                       ((vector<duckdb::BaseStatistics,_true> *)in_stack_fffffffffffffe90,
                        (size_type)in_stack_fffffffffffffe88);
  bVar1 = NumericStats::HasMinMax(in_stack_fffffffffffffe90);
  if (bVar1) {
    local_20 = NumericStats::GetMin<duckdb::timestamp_t>
                         ((BaseStatistics *)in_stack_fffffffffffffee8);
    local_28 = NumericStats::GetMax<duckdb::timestamp_t>
                         ((BaseStatistics *)in_stack_fffffffffffffee8);
    bVar1 = timestamp_t::operator>(&local_20,&local_28);
    if (bVar1) {
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    else {
      local_38 = local_20.value;
      local_30 = (int64_t)DateTrunc::
                          UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::DayOperator>
                                    ((timestamp_t)in_RDI._M_head_impl);
      local_48 = local_28.value;
      local_40 = (int64_t)DateTrunc::
                          UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::DayOperator>
                                    ((timestamp_t)in_RDI._M_head_impl);
      Value::CreateValue<duckdb::timestamp_t>((timestamp_t)in_RDI._M_head_impl);
      Value::CreateValue<duckdb::timestamp_t>((timestamp_t)in_RDI._M_head_impl);
      Value::type(&local_88);
      LogicalType::LogicalType(&in_stack_fffffffffffffe90->type,in_stack_fffffffffffffe88);
      NumericStats::CreateEmpty(in_stack_ffffffffffffff58);
      LogicalType::~LogicalType((LogicalType *)0x1edcd47);
      NumericStats::SetMin(stats_00._M_head_impl,(Value *)in_RDI._M_head_impl);
      NumericStats::SetMax(stats_00._M_head_impl,(Value *)in_RDI._M_head_impl);
      stats = vector<duckdb::BaseStatistics,_true>::operator[]
                        ((vector<duckdb::BaseStatistics,_true> *)in_stack_fffffffffffffe90,
                         (size_type)in_stack_fffffffffffffe88);
      BaseStatistics::CopyValidity((BaseStatistics *)&stack0xfffffffffffffec0,stats);
      BaseStatistics::ToUnique(in_stack_fffffffffffffed8);
      BaseStatistics::~BaseStatistics(stats);
      Value::~Value((Value *)stats);
      Value::~Value((Value *)stats);
    }
  }
  else {
    unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
    unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
              ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         stats_00._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> DateTruncStatistics(vector<BaseStatistics> &child_stats) {
	// we can only propagate date stats if the child has stats
	auto &nstats = child_stats[1];
	if (!NumericStats::HasMinMax(nstats)) {
		return nullptr;
	}
	// run the operator on both the min and the max, this gives us the [min, max] bound
	auto min = NumericStats::GetMin<TA>(nstats);
	auto max = NumericStats::GetMax<TA>(nstats);
	if (min > max) {
		return nullptr;
	}

	// Infinite values are unmodified
	auto min_part = DateTrunc::UnaryFunction<TA, TR, OP>(min);
	auto max_part = DateTrunc::UnaryFunction<TA, TR, OP>(max);

	auto min_value = Value::CreateValue(min_part);
	auto max_value = Value::CreateValue(max_part);
	auto result = NumericStats::CreateEmpty(min_value.type());
	NumericStats::SetMin(result, min_value);
	NumericStats::SetMax(result, max_value);
	result.CopyValidity(child_stats[0]);
	return result.ToUnique();
}